

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

IssuanceParameter * __thiscall
cfd::core::ConfidentialTransaction::SetAssetIssuance
          (IssuanceParameter *__return_storage_ptr__,ConfidentialTransaction *this,
          uint32_t tx_in_index,Amount *asset_amount,Script *asset_locking_script,
          ConfidentialNonce *asset_nonce,Amount *token_amount,Script *token_locking_script,
          ConfidentialNonce *token_nonce,bool is_blind,ByteData256 *contract_hash)

{
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  asset_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> asset_locking_script_list;
  vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>
  token_nonce_list;
  vector<cfd::core::Script,_std::allocator<cfd::core::Script>_> token_locking_script_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> token_output_amount_list;
  vector<cfd::core::Amount,_std::allocator<cfd::core::Amount>_> asset_output_amount_list;
  
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  asset_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  asset_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token_output_amount_list.super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  token_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  token_locking_script_list.
  super__Vector_base<cfd::core::Script,_std::allocator<cfd::core::Script>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  token_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  token_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  token_nonce_list.
  super__Vector_base<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>::
  _M_realloc_insert<cfd::core::Amount_const&>
            ((vector<cfd::core::Amount,std::allocator<cfd::core::Amount>> *)
             &asset_output_amount_list,(iterator)0x0,asset_amount);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&asset_locking_script_list,asset_locking_script);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&asset_nonce_list,asset_nonce);
  ::std::vector<cfd::core::Amount,std::allocator<cfd::core::Amount>>::
  _M_realloc_insert<cfd::core::Amount_const&>
            ((vector<cfd::core::Amount,std::allocator<cfd::core::Amount>> *)
             &token_output_amount_list,(iterator)0x0,token_amount);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::push_back
            (&token_locking_script_list,token_locking_script);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  push_back(&token_nonce_list,token_nonce);
  SetAssetIssuance(__return_storage_ptr__,this,tx_in_index,asset_amount,&asset_output_amount_list,
                   &asset_locking_script_list,&asset_nonce_list,token_amount,
                   &token_output_amount_list,&token_locking_script_list,&token_nonce_list,is_blind,
                   contract_hash);
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  ~vector(&token_nonce_list);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            (&token_locking_script_list);
  if (token_output_amount_list.
      super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(token_output_amount_list.
                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::vector<cfd::core::ConfidentialNonce,_std::allocator<cfd::core::ConfidentialNonce>_>::
  ~vector(&asset_nonce_list);
  ::std::vector<cfd::core::Script,_std::allocator<cfd::core::Script>_>::~vector
            (&asset_locking_script_list);
  if (asset_output_amount_list.
      super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(asset_output_amount_list.
                    super__Vector_base<cfd::core::Amount,_std::allocator<cfd::core::Amount>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

IssuanceParameter ConfidentialTransaction::SetAssetIssuance(
    uint32_t tx_in_index, const Amount &asset_amount,
    const Script &asset_locking_script, const ConfidentialNonce &asset_nonce,
    const Amount &token_amount, const Script &token_locking_script,
    const ConfidentialNonce &token_nonce, bool is_blind,
    const ByteData256 &contract_hash) {
  std::vector<Amount> asset_output_amount_list;
  std::vector<Script> asset_locking_script_list;
  std::vector<ConfidentialNonce> asset_nonce_list;
  std::vector<Amount> token_output_amount_list;
  std::vector<Script> token_locking_script_list;
  std::vector<ConfidentialNonce> token_nonce_list;
  asset_output_amount_list.push_back(asset_amount);
  asset_locking_script_list.push_back(asset_locking_script);
  asset_nonce_list.push_back(asset_nonce);
  token_output_amount_list.push_back(token_amount);
  token_locking_script_list.push_back(token_locking_script);
  token_nonce_list.push_back(token_nonce);
  return SetAssetIssuance(
      tx_in_index, asset_amount, asset_output_amount_list,
      asset_locking_script_list, asset_nonce_list, token_amount,
      token_output_amount_list, token_locking_script_list, token_nonce_list,
      is_blind, contract_hash);
}